

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::ValidateThreadContext(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  CriticalSection *cs;
  undefined4 *puVar3;
  ThreadContext *local_28;
  ThreadContext *currentThreadContext;
  AutoCriticalSection autocs;
  BOOL found;
  ThreadContext *this_local;
  
  autocs.cs._4_4_ = 0;
  cs = GetCriticalSection();
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&currentThreadContext,cs);
  for (local_28 = GetThreadContextList(); local_28 != (ThreadContext *)0x0;
      local_28 = JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::Next
                           (&local_28->
                             super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>))
  {
    if (local_28 == this) goto LAB_00aa6e45;
  }
  if (autocs.cs._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x27b,"(found)","invalid thread context");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
LAB_00aa6e45:
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&currentThreadContext);
  return;
}

Assistant:

void ThreadContext::ValidateThreadContext()
    {
#if DBG
    // verify the runtime pointer is valid.
        {
            BOOL found = FALSE;
            AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
            ThreadContext* currentThreadContext = GetThreadContextList();
            while (currentThreadContext)
            {
                if (currentThreadContext == this)
                {
                    return;
                }
                currentThreadContext = currentThreadContext->Next();
            }
            AssertMsg(found, "invalid thread context");
        }

#endif
}